

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O2

string * num_to_roman_abi_cxx11_(string *__return_storage_ptr__,uint32_t num)

{
  int iVar1;
  int i;
  size_type sVar2;
  pointer puVar3;
  int iVar4;
  double dVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  ostringstream oss;
  string local_1c8 [32];
  string local_1a8 [11];
  
  std::__cxx11::to_string(local_1a8,num);
  std::__cxx11::string::~string((string *)local_1a8);
  puVar3 = (pointer)0x0;
  iVar4 = 0;
  for (sVar2 = 0; local_1a8[0]._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    dVar5 = pow(10.0,(double)((int)sVar2 + 1));
    iVar1 = (int)((ulong)num % ((long)dVar5 & 0xffffffffU));
    local_1a8[0]._M_dataplus._M_p._0_4_ = iVar1 - iVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffe18,
               (uint *)local_1a8);
    iVar4 = iVar1;
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (0,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  for (; puVar3 != (pointer)0x0; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0) {
      val_to_rnum_abi_cxx11_(0);
      std::operator<<((ostream *)local_1a8,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffe18);
  return __return_storage_ptr__;
}

Assistant:

std::string num_to_roman(uint32_t num)
{
	auto size = std::to_string(num).size();
	std::vector<uint32_t> nums;
	uint32_t prev{ 0 };
	for (int i = 0; i != size; ++i)
	{
		auto div = static_cast<uint32_t>(std::pow(10, (i + 1)));
		auto curr = num % div;
		nums.push_back(curr - prev);
		prev = curr;
	}
	std::reverse(nums.begin(), nums.end());
	std::ostringstream oss;
	for (auto& n : nums)
	{
		if (n != 0)
		{
			oss << val_to_rnum(n);
		}
	}
	return oss.str();
}